

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_numbox.c
# Opt level: O0

void my_numbox_key(void *z,t_symbol *keysym,t_floatarg fkey)

{
  size_t sVar1;
  double dVar2;
  int local_30;
  char local_2c [3];
  char local_29;
  int sl;
  char buf [3];
  char c;
  t_my_numbox *x;
  t_floatarg fkey_local;
  t_symbol *keysym_local;
  void *z_local;
  
  local_29 = (char)(int)fkey;
  local_2c[1] = 0;
  _sl = (t_my_numbox *)z;
  if (local_29 == '\0') {
    *(uint *)((long)z + 0x440) = *(uint *)((long)z + 0x440) & 0xf7ffffff;
    sys_queuegui(z,*(_glist **)((long)z + 0x30),my_numbox_draw_update);
  }
  else if (((((local_29 < '0') || ('9' < local_29)) && (local_29 != '.')) &&
           ((local_29 != '-' && (local_29 != 'e')))) && ((local_29 != '+' && (local_29 != 'E')))) {
    if ((local_29 == '\b') || (local_29 == '\x7f')) {
      sVar1 = strlen((char *)((long)z + 0x4c4));
      local_30 = (int)sVar1 + -1;
      if (local_30 < 0) {
        local_30 = 0;
      }
      *(undefined1 *)((long)_sl + (long)local_30 + 0x4c4) = 0;
      sys_queuegui(_sl,*(_glist **)((long)_sl + 0x30),my_numbox_draw_update);
    }
    else if ((local_29 == '\n') || (local_29 == '\r')) {
      if (*(char *)((long)z + 0x4c4) != '\0') {
        dVar2 = atof((char *)((long)z + 0x4c4));
        _sl->x_val = (float)dVar2;
        _sl->x_buf[0] = '\0';
        if (pd_compatibilitylevel < 0x35) {
          my_numbox_clip(_sl);
        }
        sys_queuegui(_sl,(_sl->x_gui).x_glist,my_numbox_draw_update);
      }
      my_numbox_bang(_sl);
    }
  }
  else {
    sVar1 = strlen((char *)((long)z + 0x4c4));
    if (sVar1 < 0x1e) {
      local_2c[0] = local_29;
      strcat((char *)((long)_sl + 0x4c4),local_2c);
      sys_queuegui(_sl,*(_glist **)((long)_sl + 0x30),my_numbox_draw_update);
    }
  }
  return;
}

Assistant:

static void my_numbox_key(void *z, t_symbol *keysym, t_floatarg fkey)
{
    t_my_numbox *x = z;
    char c = fkey;
    char buf[3];
    buf[1] = 0;

    if(c == 0)
    {
        x->x_gui.x_fsf.x_change = 0;
        sys_queuegui(x, x->x_gui.x_glist, my_numbox_draw_update);
        return;
    }
    if(((c >= '0') && (c <= '9')) || (c == '.') || (c == '-') ||
        (c == 'e') || (c == '+') || (c == 'E'))
    {
        if(strlen(x->x_buf) < (IEMGUI_MAX_NUM_LEN-2))
        {
            buf[0] = c;
            strcat(x->x_buf, buf);
            sys_queuegui(x, x->x_gui.x_glist, my_numbox_draw_update);
        }
    }
    else if((c == '\b') || (c == 127))
    {
        int sl = (int)strlen(x->x_buf) - 1;

        if(sl < 0)
            sl = 0;
        x->x_buf[sl] = 0;
        sys_queuegui(x, x->x_gui.x_glist, my_numbox_draw_update);
    }
    else if((c == '\n') || (c == 13))
    {
        if(x->x_buf[0])
        {
            x->x_val = atof(x->x_buf);
            x->x_buf[0] = 0;
            if (pd_compatibilitylevel < 53)
                my_numbox_clip(x);
            sys_queuegui(x, x->x_gui.x_glist, my_numbox_draw_update);
        }
        my_numbox_bang(x);
    }
}